

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Symbol>::emplace<QCss::Symbol_const&>
          (QMovableArrayOps<QCss::Symbol> *this,qsizetype i,Symbol *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  Symbol *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  Symbol tmp;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  byte bVar6;
  Inserter *this_00;
  Inserter local_58;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QCss::Symbol>::needsDetach((QArrayDataPointer<QCss::Symbol> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QCss::Symbol>::freeSpaceAtEnd
                          ((QArrayDataPointer<QCss::Symbol> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<QCss::Symbol>::end((QArrayDataPointer<QCss::Symbol> *)in_RDI);
      QCss::Symbol::Symbol
                ((Symbol *)in_RDI,
                 (Symbol *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      in_RDI->displaceTo = (Symbol *)((long)&in_RDI->displaceTo->token + 1);
      goto LAB_00a4c848;
    }
    if ((in_RSI == (Symbol *)0x0) &&
       (qVar3 = QArrayDataPointer<QCss::Symbol>::freeSpaceAtBegin
                          ((QArrayDataPointer<QCss::Symbol> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<QCss::Symbol>::begin((QArrayDataPointer<QCss::Symbol> *)0xa4c71a);
      QCss::Symbol::Symbol
                ((Symbol *)in_RDI,
                 (Symbol *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      (((QString *)&in_RDI->displaceFrom)->d).d =
           (Data *)&(((QString *)&in_RDI->displaceFrom)->d).d[-3].super_QArrayData.alloc;
      in_RDI->displaceTo = (Symbol *)((long)&in_RDI->displaceTo->token + 1);
      goto LAB_00a4c848;
    }
  }
  memset(local_30,0xaa,0x28);
  QCss::Symbol::Symbol
            ((Symbol *)in_RDI,
             (Symbol *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  bVar4 = in_RDI->displaceTo != (Symbol *)0x0;
  uVar5 = bVar4 && in_RSI == (Symbol *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (Symbol *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QCss::Symbol>::detachAndGrow
            ((QArrayDataPointer<QCss::Symbol> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (Symbol **)CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff8c,uVar2))),
             (QArrayDataPointer<QCss::Symbol> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QCss::Symbol> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff8c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::insertOne(in_RDI,(Symbol *)CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::~Inserter(&local_58);
  }
  else {
    QArrayDataPointer<QCss::Symbol>::begin((QArrayDataPointer<QCss::Symbol> *)0xa4c7dc);
    QCss::Symbol::Symbol((Symbol *)in_RDI,(Symbol *)CONCAT17(uVar5,in_stack_ffffffffffffff78));
    (((QString *)&in_RDI->displaceFrom)->d).d =
         (Data *)&(((QString *)&in_RDI->displaceFrom)->d).d[-3].super_QArrayData.alloc;
    in_RDI->displaceTo = (Symbol *)((long)&in_RDI->displaceTo->token + 1);
  }
  QCss::Symbol::~Symbol((Symbol *)0xa4c848);
LAB_00a4c848:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }